

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

char * ucnv_io_getAlias(char *alias,uint16_t n,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  uint uVar3;
  uint16_t *currList;
  uint32_t listCount;
  int32_t listOffset;
  uint32_t convNum;
  UErrorCode *pErrorCode_local;
  uint16_t n_local;
  char *alias_local;
  
  UVar1 = haveAliasData(pErrorCode);
  if ((((UVar1 != '\0') && (UVar1 = isAlias(alias,pErrorCode), UVar1 != '\0')) &&
      (uVar2 = findConverter(alias,(UBool *)0x0,pErrorCode), uVar2 < gMainTable.converterListSize))
     && (uVar3 = (uint)gMainTable.taggedAliasArray
                       [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + uVar2],
        uVar3 != 0)) {
    if (n < gMainTable.taggedAliasLists[(int)uVar3]) {
      return (char *)(gMainTable.stringTable +
                     (int)(uint)gMainTable.taggedAliasLists[(long)(int)uVar3 + (ulong)n + 1]);
    }
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return (char *)0x0;
}

Assistant:

static const char *
ucnv_io_getAlias(const char *alias, uint16_t n, UErrorCode *pErrorCode) {
    if(haveAliasData(pErrorCode) && isAlias(alias, pErrorCode)) {
        uint32_t convNum = findConverter(alias, NULL, pErrorCode);
        if (convNum < gMainTable.converterListSize) {
            /* tagListNum - 1 is the ALL tag */
            int32_t listOffset = gMainTable.taggedAliasArray[(gMainTable.tagListSize - 1)*gMainTable.converterListSize + convNum];

            if (listOffset) {
                uint32_t listCount = gMainTable.taggedAliasLists[listOffset];
                /* +1 to skip listCount */
                const uint16_t *currList = gMainTable.taggedAliasLists + listOffset + 1;

                if (n < listCount)  {
                    return GET_STRING(currList[n]);
                }
                *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            }
            /* else this shouldn't happen. internal program error */
        }
        /* else converter not found */
    }
    return NULL;
}